

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_buffer.cc
# Opt level: O0

bool __thiscall
draco::EncoderBuffer::StartBitEncoding(EncoderBuffer *this,int64_t required_bits,bool encode_size)

{
  bool bVar1;
  char *pcVar2;
  BitEncoder *this_00;
  byte in_DL;
  long in_RSI;
  EncoderBuffer *in_RDI;
  char *data;
  uint64_t buffer_start_size;
  int64_t required_bytes;
  pointer in_stack_ffffffffffffff98;
  unique_ptr<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
  *in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  size_type local_30;
  bool local_1;
  
  bVar1 = bit_encoder_active(in_RDI);
  if (bVar1) {
    local_1 = false;
  }
  else if (in_RSI < 1) {
    local_1 = false;
  }
  else {
    in_RDI->encode_bit_sequence_size_ = (bool)(in_DL & 1);
    in_RDI->bit_encoder_reserved_bytes_ = (in_RSI + 7) / 8;
    local_30 = std::vector<char,_std::allocator<char>_>::size(&in_RDI->buffer_);
    if ((bool)(in_DL & 1) != false) {
      local_30 = local_30 + 8;
    }
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x185516);
    this_00 = (BitEncoder *)operator_new(0x10);
    BitEncoder::BitEncoder(this_00,pcVar2 + local_30);
    std::
    unique_ptr<draco::EncoderBuffer::BitEncoder,std::default_delete<draco::EncoderBuffer::BitEncoder>>
    ::unique_ptr<std::default_delete<draco::EncoderBuffer::BitEncoder>,void>
              ((unique_ptr<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                *)this_00,in_stack_ffffffffffffff98);
    std::
    unique_ptr<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
    ::operator=((unique_ptr<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                 *)this_00,
                (unique_ptr<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
                 *)in_stack_ffffffffffffff98);
    std::
    unique_ptr<draco::EncoderBuffer::BitEncoder,_std::default_delete<draco::EncoderBuffer::BitEncoder>_>
    ::~unique_ptr(in_stack_ffffffffffffffb0);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool EncoderBuffer::StartBitEncoding(int64_t required_bits, bool encode_size) {
  if (bit_encoder_active()) {
    return false;  // Bit encoding mode already active.
  }
  if (required_bits <= 0) {
    return false;  // Invalid size.
  }
  encode_bit_sequence_size_ = encode_size;
  const int64_t required_bytes = (required_bits + 7) / 8;
  bit_encoder_reserved_bytes_ = required_bytes;
  uint64_t buffer_start_size = buffer_.size();
  if (encode_size) {
    // Reserve memory for storing the encoded bit sequence size. It will be
    // filled once the bit encoding ends.
    buffer_start_size += sizeof(uint64_t);
  }
  // Resize buffer to fit the maximum size of encoded bit data.
  buffer_.resize(buffer_start_size + required_bytes);
  // Get the buffer data pointer for the bit encoder.
  const char *const data = buffer_.data() + buffer_start_size;
  bit_encoder_ =
      std::unique_ptr<BitEncoder>(new BitEncoder(const_cast<char *>(data)));
  return true;
}